

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::AddHorzJoin(Clipper *this,TEdge *e,int idx)

{
  value_type local_28;
  HorzJoinRec *hj;
  TEdge *pTStack_18;
  int idx_local;
  TEdge *e_local;
  Clipper *this_local;
  
  hj._4_4_ = idx;
  pTStack_18 = e;
  e_local = (TEdge *)this;
  local_28 = (value_type)operator_new(0x10);
  local_28->edge = pTStack_18;
  local_28->savedIdx = hj._4_4_;
  std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::push_back
            (&this->m_HorizJoins,&local_28);
  return;
}

Assistant:

void Clipper::AddHorzJoin(TEdge *e, int idx)
{
  HorzJoinRec* hj = new HorzJoinRec;
  hj->edge = e;
  hj->savedIdx = idx;
  m_HorizJoins.push_back(hj);
}